

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O0

QDomNodePrivate * __thiscall
QDomNodePrivate::removeChild(QDomNodePrivate *this,QDomNodePrivate *oldChild)

{
  QDomNodePrivate *pQVar1;
  QDomDocumentPrivate *this_00;
  QDomNodePrivate *in_RSI;
  QDomNodePrivate *in_RDI;
  QDomDocumentPrivate *doc;
  QDomNodePrivate *local_8;
  
  pQVar1 = parent(in_RSI);
  if (pQVar1 == in_RDI) {
    this_00 = ownerDocument(in_RSI);
    if (this_00 != (QDomDocumentPrivate *)0x0) {
      this_00->nodeListTime = this_00->nodeListTime + 1;
    }
    if (((in_RSI->next == (QDomNodePrivate *)0x0) && (in_RSI->prev == (QDomNodePrivate *)0x0)) &&
       (in_RDI->first != in_RSI)) {
      local_8 = (QDomNodePrivate *)0x0;
    }
    else {
      if (in_RSI->next != (QDomNodePrivate *)0x0) {
        in_RSI->next->prev = in_RSI->prev;
      }
      if (in_RSI->prev != (QDomNodePrivate *)0x0) {
        in_RSI->prev->next = in_RSI->next;
      }
      if (in_RDI->last == in_RSI) {
        in_RDI->last = in_RSI->prev;
      }
      if (in_RDI->first == in_RSI) {
        in_RDI->first = in_RSI->next;
      }
      setNoParent(&this_00->super_QDomNodePrivate);
      in_RSI->next = (QDomNodePrivate *)0x0;
      in_RSI->prev = (QDomNodePrivate *)0x0;
      QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x10fac4);
      local_8 = in_RSI;
    }
  }
  else {
    local_8 = (QDomNodePrivate *)0x0;
  }
  return local_8;
}

Assistant:

QDomNodePrivate* QDomNodePrivate::removeChild(QDomNodePrivate* oldChild)
{
    // Error check
    if (oldChild->parent() != this)
        return nullptr;

    // "mark lists as dirty"
    QDomDocumentPrivate *const doc = ownerDocument();
    if (doc)
        doc->nodeListTime++;

    // Perhaps oldChild was just created with "createElement" or that. In this case
    // its parent is QDomDocument but it is not part of the documents child list.
    if (oldChild->next == nullptr && oldChild->prev == nullptr && first != oldChild)
        return nullptr;

    if (oldChild->next)
        oldChild->next->prev = oldChild->prev;
    if (oldChild->prev)
        oldChild->prev->next = oldChild->next;

    if (last == oldChild)
        last = oldChild->prev;
    if (first == oldChild)
        first = oldChild->next;

    oldChild->setNoParent();
    oldChild->next = nullptr;
    oldChild->prev = nullptr;

    // We are no longer interested in the old node
    oldChild->ref.deref();

    return oldChild;
}